

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O0

void __thiscall ArrayType::GenInitCode(ArrayType *this,Output *out_cc,Env *env)

{
  bool bVar1;
  char *pcVar2;
  ID *in_RDX;
  ArrayType *in_RSI;
  Type *in_RDI;
  Env *unaff_retaddr;
  Output *in_stack_00000008;
  Type *in_stack_00000010;
  
  pcVar2 = Type::lvalue((Type *)0x122bdc);
  Output::println((Output *)in_RSI,"%s = nullptr;",pcVar2);
  Type::GenInitCode(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  bVar1 = Type::incremental_parsing(in_RDI);
  if (bVar1) {
    elem_it_var(in_RSI);
    pcVar2 = Env::LValue((Env *)in_RSI,in_RDX);
    Output::println((Output *)in_RSI,"%s = -1;",pcVar2);
  }
  return;
}

Assistant:

void ArrayType::GenInitCode(Output* out_cc, Env* env)
	{
	// Do not initiate the array here
	// out_cc->println("%s = new %s;", lvalue(), vector_str_.c_str());
	out_cc->println("%s = nullptr;", lvalue());

	Type::GenInitCode(out_cc, env);
	if ( incremental_parsing() )
		{
		out_cc->println("%s = -1;", env->LValue(elem_it_var()));
		}
	}